

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_constructor_injection_with_constructor_definition.cpp
# Opt level: O0

int main(void)

{
  dependency args;
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *pdVar1;
  T TVar2;
  dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_annotated_constructor_injection_with_constructor_definition_cpp:15:13),_void,_boost::ext::di::v1_3_0::core::none>
  args_1;
  int local_38;
  int iStack_34;
  T object;
  int local_24;
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_annotated_constructor_injection_with_constructor_definition_cpp:14:13),_void,_boost::ext::di::v1_3_0::core::none>
  local_1d;
  scope<int,_int,_int> local_1c;
  undefined1 local_18 [8];
  i injector;
  
  injector.super_injector_t.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_annotated_constructor_injection_with_constructor_definition_cpp:14:13),_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_annotated_constructor_injection_with_constructor_definition_cpp:15:13),_void,_boost::ext::di::v1_3_0::core::none>_>_>
  .
  super_dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_annotated_constructor_injection_with_constructor_definition_cpp:15:13),_void,_boost::ext::di::v1_3_0::core::none>
  .super_scope<int,_int,_int>.object_ = (scope<int,_int,_int>)0;
  pdVar1 = boost::ext::di::v1_3_0::core::
           dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
           ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                         *)&boost::ext::di::v1_3_0::bind<int>);
  boost::ext::di::v1_3_0::core::
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  ::
  named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_annotated_constructor_injection_with_constructor_definition_cpp:14:13),_0>
            (pdVar1,(anon_class_1_0_00000001 *)&int1);
  local_24 = 0x2a;
  local_1c.object_ =
       (int)boost::ext::di::v1_3_0::core::
            dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/annotated_constructor_injection_with_constructor_definition.cpp:14:13),_void,_boost::ext::di::v1_3_0::core::none>
            ::to<int,_0,_0>(&local_1d,&local_24);
  pdVar1 = boost::ext::di::v1_3_0::core::
           dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
           ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                         *)&boost::ext::di::v1_3_0::bind<int>);
  boost::ext::di::v1_3_0::core::
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  ::
  named<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_annotated_constructor_injection_with_constructor_definition_cpp:15:13),_0>
            (pdVar1,(anon_class_1_0_00000001 *)&int2);
  object.a = 0x57;
  args = boost::ext::di::v1_3_0::core::
         dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/annotated_constructor_injection_with_constructor_definition.cpp:15:13),_void,_boost::ext::di::v1_3_0::core::none>
         ::to<int,_0,_0>((dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_annotated_constructor_injection_with_constructor_definition_cpp:15:13),_void,_boost::ext::di::v1_3_0::core::none>
                          *)((long)&object.b + 3),&object.a);
  local_18 = (undefined1  [8])
             boost::ext::di::v1_3_0::
             make_injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_annotated_constructor_injection_with_constructor_definition_cpp:14:13),_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_annotated_constructor_injection_with_constructor_definition_cpp:15:13),_void,_boost::ext::di::v1_3_0::core::none>,_0,_0>
                       ((i *)(ulong)(uint)local_1c.object_,
                        (dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_annotated_constructor_injection_with_constructor_definition_cpp:14:13),_void,_boost::ext::di::v1_3_0::core::none>
                         )args.super_scope<int,_int,_int>.object_,args_1);
  TVar2 = boost::ext::di::v1_3_0::core::
          injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/annotated_constructor_injection_with_constructor_definition.cpp:14:13),_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/annotated_constructor_injection_with_constructor_definition.cpp:15:13),_void,_boost::ext::di::v1_3_0::core::none>_>
          ::create<T,_0>((injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_annotated_constructor_injection_with_constructor_definition_cpp:14:13),_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_annotated_constructor_injection_with_constructor_definition_cpp:15:13),_void,_boost::ext::di::v1_3_0::core::none>_>
                          *)local_18);
  local_38 = TVar2.a;
  if (local_38 != 0x2a) {
    __assert_fail("42 == object.a",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/annotated_constructor_injection_with_constructor_definition.cpp"
                  ,0x21,"int main()");
  }
  iStack_34 = TVar2.b;
  if (iStack_34 == 0x57) {
    return (int)injector.super_injector_t.
                super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_annotated_constructor_injection_with_constructor_definition_cpp:14:13),_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_annotated_constructor_injection_with_constructor_definition_cpp:15:13),_void,_boost::ext::di::v1_3_0::core::none>_>_>
                .
                super_dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_user_guide_annotated_constructor_injection_with_constructor_definition_cpp:15:13),_void,_boost::ext::di::v1_3_0::core::none>
                .super_scope<int,_int,_int>.object_;
  }
  __assert_fail("87 == object.b",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/annotated_constructor_injection_with_constructor_definition.cpp"
                ,0x22,"int main()");
}

Assistant:

int main() {
  // clang-format off
  auto injector = di::make_injector(
    di::bind<int>().named(int1).to(42)
  , di::bind<int>().named(int2).to(87)
  );
  // clang-format on
  auto object = injector.create<T>();
  assert(42 == object.a);
  assert(87 == object.b);
}